

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_log2.hpp
# Opt level: O2

int boost::integer_log2<unsigned_long>(unsigned_long x)

{
  int iVar1;
  
  if (x != 0) {
    iVar1 = detail::integer_log2_impl<unsigned_long>(x,0x20);
    return iVar1;
  }
  __assert_fail("x > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/integer/integer_log2.hpp"
                ,0x60,"int boost::integer_log2(T) [T = unsigned long]");
}

Assistant:

int integer_log2(T x) {

     assert(x > 0);

     const int n = detail::max_pow2_less<
                     detail::width<T> :: value, 4
                   > :: value;

     return detail::integer_log2_impl(x, n);

 }